

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block1394.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int extraout_EAX;
  ulong uVar7;
  undefined4 extraout_var;
  uint *__ptr;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  short sVar12;
  ulong uVar13;
  bool bVar14;
  quadlet_t data1;
  uint local_5c;
  ulong local_58;
  int local_50;
  uint local_4c;
  char *local_48;
  ulonglong local_40;
  ulong local_38;
  
  signal(2,signal_handler);
  local_48 = strstr(*argv,"quad1394");
  if (argc < 2) {
    bVar14 = true;
    __ptr = &local_5c;
    local_58 = 1;
    uVar6 = 0;
    local_38 = 0;
    iVar11 = 0;
  }
  else {
    local_58 = 1;
    __ptr = &local_5c;
    uVar13 = 1;
    iVar5 = 0;
    local_50 = 0;
    iVar11 = 0;
    local_38 = 0;
    local_4c = 0;
    do {
      pcVar10 = argv[uVar13];
      if (*pcVar10 == '-') {
        cVar1 = pcVar10[1];
        if (cVar1 == 'd') {
          local_50 = 1;
        }
        else {
          if (cVar1 == 'n') {
            iVar3 = atoi(pcVar10 + 2);
            local_38 = CONCAT44(extraout_var,iVar3);
            pcVar10 = "Selecting node %d\n";
          }
          else {
            if (cVar1 != 'p') goto LAB_001015f1;
            local_4c = atoi(pcVar10 + 2);
            pcVar10 = "Selecting port %d\n";
          }
          printf(pcVar10);
        }
      }
      else {
        if (iVar11 == 0) {
          local_40 = strtoull(pcVar10,(char **)0x0,0x10);
        }
        else if (iVar11 == 1 && local_48 != (char *)0x0) {
          uVar7 = strtoul(pcVar10,(char **)0x0,0x10);
          uVar6 = (uint)uVar7;
          local_5c = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
          ;
        }
        else if (iVar11 == 1 && local_48 == (char *)0x0) {
          local_58 = strtoul(pcVar10,(char **)0x0,10);
          __ptr = (uint *)calloc(4,(long)(int)local_58);
          if (__ptr == (uint *)0x0) {
            main_cold_1();
            goto LAB_0010186b;
          }
        }
        else if ((local_48 == (char *)0x0) && (iVar5 < (int)local_58)) {
          uVar7 = strtoul(pcVar10,(char **)0x0,0x10);
          uVar6 = (uint)uVar7;
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          __ptr[lVar9] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                         uVar6 << 0x18;
        }
        else {
          fprintf(_stderr,"Warning: extra parameter: %s\n");
        }
        iVar11 = iVar11 + 1;
      }
LAB_001015f1:
      uVar13 = uVar13 + 1;
    } while ((uint)argc != uVar13);
    bVar14 = local_50 == 0;
    uVar6 = local_4c;
  }
  if (iVar11 < 1) {
LAB_0010186b:
    pcVar10 = 
    "Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n";
    if (local_48 != (char *)0x0) {
      pcVar10 = "Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n";
    }
    printf(pcVar10,*argv);
    puts("       where P = port number, N = node number");
    exit(0);
  }
  handle = (raw1394handle_t)raw1394_new_handle();
  if (handle == (raw1394handle_t)0x0) {
    main_cold_7();
LAB_001018a6:
    main_cold_6();
LAB_001018ab:
    main_cold_2();
  }
  else {
    raw1394_set_bus_reset_handler(handle,reset_handler);
    uVar4 = raw1394_get_port_info(handle,0,0);
    if ((int)uVar4 < 0) goto LAB_001018a6;
    if (uVar4 <= uVar6) goto LAB_001018ab;
    iVar5 = raw1394_set_port(handle,uVar6);
    if (iVar5 == 0) {
      uVar6 = raw1394_get_local_id(handle);
      if (!bVar14) {
        uVar8 = raw1394_get_libversion();
        printf("libraw1394_version = %s  local_node_id = %x\n",uVar8,(ulong)uVar6 & 0xffff);
      }
      uVar4 = raw1394_get_nodecount(handle);
      uVar13 = local_38;
      sVar12 = (short)local_38;
      uVar7 = local_38 & 0xffff;
      if (sVar12 == 0x3f) {
        puts("**** Warning: Broadcasting message ");
        printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n",0xfffff0000800);
LAB_00101733:
        uVar2 = local_58;
        uVar6 = (uVar6 & 0xffffffc0) + (int)uVar13;
        bVar14 = 2 < iVar11;
        if (local_48 != (char *)0x0) {
          bVar14 = iVar11 != 1;
        }
        iVar11 = (int)local_58;
        if (bVar14) {
          uVar6 = uVar6 & 0xffff;
          if (sVar12 == 0x3f) {
            iVar5 = raw1394_start_write(handle,uVar6,local_40,(long)(iVar11 << 2),__ptr,0xb);
          }
          else {
            iVar5 = raw1394_write(handle,uVar6,local_40,(long)(iVar11 << 2),__ptr);
          }
        }
        else {
          if (sVar12 == 0x3f) {
            fprintf(_stderr,"**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n"
                    ,uVar7,(ulong)uVar4);
          }
          iVar5 = raw1394_read(handle,uVar6 & 0xffff,local_40,(long)(iVar11 * 4),__ptr);
          if (iVar5 == 0) {
            if (iVar11 < 1) {
              iVar5 = 0;
            }
            else {
              iVar5 = 0;
              uVar13 = 0;
              do {
                uVar6 = __ptr[uVar13];
                printf("0x%08X\n",
                       (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              uVar6 << 0x18));
                uVar13 = uVar13 + 1;
              } while ((uVar2 & 0xffffffff) != uVar13);
            }
          }
        }
        if (iVar5 != 0) {
          main_cold_5();
        }
        if (__ptr != &local_5c) {
          free(__ptr);
        }
        raw1394_destroy_handle(handle);
        return 0;
      }
      if ((int)uVar7 < (int)uVar4) goto LAB_00101733;
      goto LAB_001018bd;
    }
  }
  main_cold_3();
LAB_001018bd:
  main_cold_4();
  return extraout_EAX;
}

Assistant:

int main(int argc, char** argv)
{
    int i, j, rc, args_found;
    int nports;
    int port;
    nodeid_t node;
    nodeaddr_t addr;
    int size;
    quadlet_t data1;
    quadlet_t *data = &data1;

    signal(SIGINT, signal_handler);

    int isQuad1394 = (strstr(argv[0], "quad1394") != 0);
    int isBroadcast = 0;
    int isDebug = 0;

    port = 0;
    node = 0;
    size = 1;
    j = 0;
    args_found = 0;
    for (i = 1; i < argc; i++) {
        if (argv[i][0] == '-') {
            if (argv[i][1] == 'p') {
                port = atoi(argv[i]+2);
                printf("Selecting port %d\n", port);
            }
            else if (argv[i][1] == 'n') {
                node = atoi(argv[i]+2);
                printf("Selecting node %d\n", node);
            }
            else if (argv[i][1] == 'd') {
                isDebug = 1;
            }
        }
        else {
            if (args_found == 0)
                addr = strtoull(argv[i], 0, 16);
            else if ((args_found == 1) && (isQuad1394))
                data1 = bswap_32(strtoul(argv[i], 0, 16));
            else if ((args_found == 1) && (!isQuad1394)) {
                size = strtoul(argv[i], 0, 10);
                /* Allocate data array, initializing contents to 0 */
                data = (quadlet_t *) calloc(sizeof(quadlet_t), size);
                if (!data) {
                    fprintf(stderr, "Failed to allocate memory for %d quadlets", size);
                    exit(-1);
                }
            }
            else if (!isQuad1394 && (j < size))
                data[j++] = bswap_32(strtoul(argv[i], 0, 16));
            else
                fprintf(stderr, "Warning: extra parameter: %s\n", argv[i]);

            args_found++;
        }
    }

    if (args_found < 1) {
        if (isQuad1394)
            printf("Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n", argv[0]);
        else
            printf("Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n", argv[0]);
        printf("       where P = port number, N = node number\n");
        exit(0);
    }

    /* get handle to device and check for errors */
    handle = raw1394_new_handle();
    if (handle == NULL) {
        fprintf(stderr, "**** Error: could not open 1394 handle\n");
        exit(-1);
    }

    /* set the bus reset handler */
    raw1394_set_bus_reset_handler(handle, reset_handler);

    /* get number of ports and check for errors */
    nports = raw1394_get_port_info(handle, NULL, 0);
    if (nports < 0) {
        fprintf(stderr, "**** Error: could not get port info\n");
        exit(-1);
    }
    if ((port < 0) || (port >= nports)) {
        fprintf(stderr, "**** Error: port %d does not exist (num ports = %d)\n", port, nports);
        exit(-1);
    }

    /* set handle to current port and skip errors */
    rc = raw1394_set_port(handle, port);
    if (rc) {
        fprintf(stderr, "**** Error setting port %d\n", port);
        exit(-1);
    }

    // get local id and printf libraw1394 version & local_node_id for debugging
    nodeid_t id = raw1394_get_local_id(handle);
    if (isDebug) {
        printf("libraw1394_version = %s  local_node_id = %x\n", raw1394_get_libversion(), id);
    }

    /* get number of nodes connected to current port/handle */
    int nnodes = raw1394_get_nodecount(handle);
    //    bool
    if (node == 63) {
        isBroadcast = 1;
        printf("**** Warning: Broadcasting message \n");
        printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n", CSR_CONFIG_ROM_END + CSR_REGISTER_BASE);
    } else if ((node < 0) || (node >= nnodes)) {
        fprintf(stderr, "**** Error: node %d does not exist (num nodes = %d)\n", node, nnodes);
        exit(-1);
    }
    nodeid_t target_node = (id & 0xFFC0)+node;

    /* determine whether to read or write based on args_found */
    if ((isQuad1394 && (args_found == 1)) ||
            (!isQuad1394 && (args_found <= 2)))
    {
        if (isBroadcast) {
            fprintf(stderr, "**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n", node, nnodes);
        }

        /* read the data block and print out the values */
        rc = raw1394_read(handle, target_node, addr, size*4, data);
        if (!rc) {
            for (j=0; j<size; j++)
                printf("0x%08X\n", bswap_32(data[j]));
        }
    } else {
        /* for write */
        if (isBroadcast) {
            // broadcast, no ack is expected
            rc = raw1394_start_write(handle, target_node, addr, size*4, data, 11);
        } else {
            // asynchronous write
            rc = raw1394_write(handle, target_node, addr, size*4, data);
        }
    }
    if (rc) {
        fprintf(stderr, "**** Error: errno = %d %s \n", errno, strerror(errno));
    }

    // Free memory if it was dynamically allocated
    if (data != &data1)
        free(data);

    raw1394_destroy_handle(handle);
    return 0;
}